

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test9.cpp
# Opt level: O1

int main(void)

{
  __pid_t msg;
  Writer *pWVar1;
  long in_FS_OFFSET;
  InetAddress listenAddr;
  TcpServer server;
  EventLoop loop;
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  local_178;
  InetAddress local_158;
  undefined1 local_148 [40];
  char *local_120;
  VerboseLevel local_118;
  _Any_data local_110;
  Logger *local_100;
  _Invoker_type local_f8;
  _Any_data local_f0;
  pointer pbStack_e0;
  pointer local_d8;
  EventLoop local_98;
  
  local_148._0_8_ = &PTR__Writer_00134af0;
  local_148._8_8_ = (LogMessage *)0x0;
  local_148._16_4_ = Info;
  local_148._24_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/tests/test9.cpp"
  ;
  local_148._32_8_ = 0x1e;
  local_120 = "int main()";
  local_118 = 0;
  local_110._M_unused._M_object = (Logger *)0x0;
  local_110._M_pod_data[8] = false;
  local_100 = (Logger *)0x0;
  local_f8 = (_Invoker_type)0x125baf;
  local_f0._0_4_ = NormalLog;
  local_f0._8_8_ = (pointer)0x0;
  pbStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  pWVar1 = el::base::Writer::construct((Writer *)local_148,1,"default");
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,"main: pid = ");
  }
  msg = getpid();
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,msg);
  }
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,", tid = ");
  }
  if (*(int *)(in_FS_OFFSET + -8) == 0) {
    mario::CurrentThread::cacheTid();
  }
  if (pWVar1->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,*(int *)(in_FS_OFFSET + -8));
  }
  el::base::Writer::~Writer((Writer *)local_148);
  mario::InetAddress::InetAddress(&local_158,0x26fd);
  mario::EventLoop::EventLoop(&local_98);
  mario::TcpServer::TcpServer((TcpServer *)local_148,&local_98,&local_158);
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object = onConnection;
  local_178._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&)>
       ::_M_manager;
  std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)&local_110,
             (function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)&local_178);
  if (local_178.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_178.super__Function_base._M_manager)
              ((_Any_data *)&local_178,(_Any_data *)&local_178,__destroy_functor);
  }
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object = onMessage;
  local_178._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp),_void_(*)(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
       ::_M_manager;
  std::
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  ::operator=((function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
               *)&local_f0,&local_178);
  if (local_178.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_178.super__Function_base._M_manager)
              ((_Any_data *)&local_178,(_Any_data *)&local_178,__destroy_functor);
  }
  mario::TcpServer::setThreadNum((TcpServer *)local_148,3);
  mario::TcpServer::start((TcpServer *)local_148);
  mario::EventLoop::loop(&local_98);
  mario::TcpServer::~TcpServer((TcpServer *)local_148);
  mario::EventLoop::~EventLoop(&local_98);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::InetAddress listenAddr(9981);
    mario::EventLoop loop;

    mario::TcpServer server(&loop, listenAddr);
    server.setConnectionCallback(onConnection);
    server.setMessageCallback(onMessage);
    server.setThreadNum(3);
    server.start();

    loop.loop();
}